

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O3

int EncodeAlphaInternal(uint8_t *data,int width,int height,int method,int filter,int reduce_levels,
                       int effort_level,uint8_t *tmp_alpha,FilterTrial *result)

{
  VP8BitWriter *bw;
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  uint8_t *size;
  char cVar6;
  bool bVar7;
  VP8LBitWriter tmp_bw;
  WebPConfig config;
  uint8_t *local_1e8;
  VP8LBitWriter local_1d8;
  WebPConfig local_1a4;
  WebPPicture local_130;
  
  if (WebPFilters[filter] != (WebPFilterFunc)0x0) {
    (*WebPFilters[filter])(data,width,height,width,tmp_alpha);
    data = tmp_alpha;
  }
  size = (uint8_t *)(long)(height * width);
  if (method == 0) {
    cVar6 = '\0';
    bVar1 = true;
    local_1e8 = data;
LAB_001361e8:
    bVar4 = cVar6 + (char)filter * '\x04';
    bVar5 = bVar4 | 0x10;
    if (reduce_levels == 0) {
      bVar5 = bVar4;
    }
    local_130.use_argb = CONCAT31(local_130.use_argb._1_3_,bVar5);
    bw = &result->bw;
    iVar2 = VP8BitWriterInit(bw,(size_t)(size + 1));
    if ((iVar2 == 0) || (iVar2 = VP8BitWriterAppend(bw,(uint8_t *)&local_130,1), iVar2 == 0)) {
      bVar7 = false;
    }
    else {
      iVar2 = VP8BitWriterAppend(bw,local_1e8,(size_t)size);
      bVar7 = iVar2 != 0;
    }
    if (!bVar1) {
      VP8LBitWriterWipeOut(&local_1d8);
    }
    uVar3 = 0;
    if (bVar7) {
      uVar3 = (uint)((result->bw).error == 0);
    }
    result->score = (result->bw).pos;
    return uVar3;
  }
  iVar2 = VP8LBitWriterInit(&local_1d8,(ulong)size >> 3);
  if ((iVar2 != 0) && (iVar2 = WebPPictureInitInternal(&local_130,0x210), iVar2 != 0)) {
    local_130.stats = &result->stats;
    local_130.use_argb = 1;
    local_130.width = width;
    local_130.height = height;
    iVar2 = WebPPictureAlloc(&local_130);
    if (iVar2 != 0) {
      (*WebPDispatchAlphaToGreen)
                (data,width,local_130.width,local_130.height,local_130.argb,local_130.argb_stride);
      iVar2 = WebPConfigInitInternal(&local_1a4,WEBP_PRESET_DEFAULT,75.0,0x210);
      if (iVar2 != 0) {
        local_1a4.lossless = 1;
        local_1a4.exact = 1;
        local_1a4.method = effort_level;
        if (effort_level == 6 && reduce_levels == 0) {
          local_1a4.quality = 100.0;
        }
        else {
          local_1a4.quality = (float)effort_level * 8.0;
        }
        iVar2 = VP8LEncodeStream(&local_1a4,&local_130,&local_1d8);
        WebPPictureFree(&local_130);
        if ((iVar2 == 0) || (local_1d8.error != 0)) {
          VP8LBitWriterWipeOut(&local_1d8);
        }
        else {
          local_1e8 = VP8LBitWriterFinish(&local_1d8);
          if (local_1d8.error == 0) {
            cVar6 = '\0';
            if (size < local_1d8.cur + ((long)(local_1d8.used + 7 >> 3) - (long)local_1d8.buf)) {
              VP8LBitWriterWipeOut(&local_1d8);
              bVar1 = true;
              local_1e8 = data;
            }
            else {
              cVar6 = '\x01';
              bVar1 = false;
              size = local_1d8.cur + ((long)(local_1d8.used + 7 >> 3) - (long)local_1d8.buf);
            }
            goto LAB_001361e8;
          }
        }
      }
    }
  }
  VP8LBitWriterWipeOut(&local_1d8);
  (result->bw).max_pos = 0;
  *(undefined8 *)&(result->bw).error = 0;
  (result->bw).buf = (uint8_t *)0x0;
  (result->bw).pos = 0;
  (result->bw).range = 0;
  (result->bw).value = 0;
  (result->bw).run = 0;
  (result->bw).nb_bits = 0;
  return 0;
}

Assistant:

static int EncodeAlphaInternal(const uint8_t* const data, int width, int height,
                               int method, int filter, int reduce_levels,
                               int effort_level,  // in [0..6] range
                               uint8_t* const tmp_alpha,
                               FilterTrial* result) {
  int ok = 0;
  const uint8_t* alpha_src;
  WebPFilterFunc filter_func;
  uint8_t header;
  const size_t data_size = width * height;
  const uint8_t* output = NULL;
  size_t output_size = 0;
  VP8LBitWriter tmp_bw;

  assert((uint64_t)data_size == (uint64_t)width * height);  // as per spec
  assert(filter >= 0 && filter < WEBP_FILTER_LAST);
  assert(method >= ALPHA_NO_COMPRESSION);
  assert(method <= ALPHA_LOSSLESS_COMPRESSION);
  assert(sizeof(header) == ALPHA_HEADER_LEN);

  filter_func = WebPFilters[filter];
  if (filter_func != NULL) {
    filter_func(data, width, height, width, tmp_alpha);
    alpha_src = tmp_alpha;
  }  else {
    alpha_src = data;
  }

  if (method != ALPHA_NO_COMPRESSION) {
    ok = VP8LBitWriterInit(&tmp_bw, data_size >> 3);
    ok = ok && EncodeLossless(alpha_src, width, height, effort_level,
                              !reduce_levels, &tmp_bw, &result->stats);
    if (ok) {
      output = VP8LBitWriterFinish(&tmp_bw);
      if (tmp_bw.error) {
        VP8LBitWriterWipeOut(&tmp_bw);
        memset(&result->bw, 0, sizeof(result->bw));
        return 0;
      }
      output_size = VP8LBitWriterNumBytes(&tmp_bw);
      if (output_size > data_size) {
        // compressed size is larger than source! Revert to uncompressed mode.
        method = ALPHA_NO_COMPRESSION;
        VP8LBitWriterWipeOut(&tmp_bw);
      }
    } else {
      VP8LBitWriterWipeOut(&tmp_bw);
      memset(&result->bw, 0, sizeof(result->bw));
      return 0;
    }
  }

  if (method == ALPHA_NO_COMPRESSION) {
    output = alpha_src;
    output_size = data_size;
    ok = 1;
  }

  // Emit final result.
  header = method | (filter << 2);
  if (reduce_levels) header |= ALPHA_PREPROCESSED_LEVELS << 4;

  if (!VP8BitWriterInit(&result->bw, ALPHA_HEADER_LEN + output_size)) ok = 0;
  ok = ok && VP8BitWriterAppend(&result->bw, &header, ALPHA_HEADER_LEN);
  ok = ok && VP8BitWriterAppend(&result->bw, output, output_size);

  if (method != ALPHA_NO_COMPRESSION) {
    VP8LBitWriterWipeOut(&tmp_bw);
  }
  ok = ok && !result->bw.error;
  result->score = VP8BitWriterSize(&result->bw);
  return ok;
}